

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall Cache::PLRUUpdate(Cache *this,uint32_t block_id)

{
  uint uVar1;
  int iVar2;
  int tmp;
  int node;
  uint32_t id2;
  uint32_t set_id;
  uint32_t block_id_local;
  Cache *this_local;
  
  uVar1 = (this->policy).associativity;
  tmp = block_id % (this->policy).associativity;
  for (node = 1; (uint)node < (this->policy).associativity; node = node * 2 + iVar2) {
    this->plru_bit[block_id / uVar1][node] = (uint)(tmp % 2 == 0);
    iVar2 = tmp % 2;
    tmp = tmp / 2;
  }
  return;
}

Assistant:

void Cache::PLRUUpdate(uint32_t block_id) {
    uint32_t set_id = block_id / this->policy.associativity;
    uint32_t id2 = block_id % this->policy.associativity;
    int node, tmp;
    for (node = 1, tmp = id2; node < this->policy.associativity;) {
        plru_bit[set_id][node] = tmp % 2 == 0 ? 1 : 0;
        node = node * 2 + tmp % 2;
        tmp /= 2;
    }
}